

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::BufferMapReadWriteCase::iterate(BufferMapReadWriteCase *this)

{
  int iVar1;
  RenderContext *renderCtx;
  bool bVar2;
  deUint32 seed;
  deUint32 buffer;
  uint uVar3;
  GLenum GVar4;
  deBool dVar5;
  uint uVar6;
  TestLog *log_00;
  char *pcVar7;
  TestLog *log_01;
  deUint8 *pdVar8;
  TestError *this_00;
  deUint8 *pdVar9;
  void *ptr;
  bool isOk;
  BufferVerifier local_40;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  deUint32 buf;
  deUint32 dataSeed;
  TestLog *log;
  BufferMapReadWriteCase *this_local;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar7);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)&verifier);
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log_01 = tcu::TestContext::getLog
                     ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            (&local_40,renderCtx,log_01,this->m_verify);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize
            ((ReferenceBuffer *)&verifier,this->m_bufferSize);
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar8,this->m_bufferSize,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,buffer);
  GVar4 = this->m_bufferTarget;
  iVar1 = this->m_bufferSize;
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,GVar4,(long)iVar1,pdVar8,this->m_usage);
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  uVar3 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    (&local_40,(EVP_PKEY_CTX *)(ulong)buffer,pdVar8,0,
                     (uchar *)(ulong)(uint)this->m_bufferSize,(ulong)this->m_bufferTarget);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,buffer);
  pdVar8 = (deUint8 *)
           glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,
                      (long)this->m_mapOffset,(long)this->m_mapSize,3);
  GVar4 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar4,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x1fc);
  while ((dVar5 = ::deGetFalse(), dVar5 == 0 && (pdVar8 != (deUint8 *)0x0))) {
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      pdVar9 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr
                         ((ReferenceBuffer *)&verifier,this->m_mapOffset);
      bVar2 = deqp::gls::BufferTestUtil::compareByteArrays(log_00,pdVar8,pdVar9,this->m_mapSize);
      pdVar9 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr
                         ((ReferenceBuffer *)&verifier,this->m_mapOffset);
      deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar9,this->m_mapSize,seed & 0xabcdef);
      pdVar9 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr
                         ((ReferenceBuffer *)&verifier,this->m_mapOffset);
      ::deMemcpy(pdVar8,pdVar9,(long)this->m_mapSize);
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget);
      GVar4 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
      glu::checkError(GVar4,"glUnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                      ,0x207);
      pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
      uVar6 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                        (&local_40,(EVP_PKEY_CTX *)(ulong)buffer,pdVar8,0,
                         (uchar *)(ulong)(uint)this->m_bufferSize,(ulong)this->m_bufferTarget);
      bVar2 = (uVar6 & 1) != 0 && (bVar2 && (uVar3 & 1) != 0);
      deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
      pcVar7 = "Buffer verification failed";
      if (bVar2) {
        pcVar7 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar2
                 ,pcVar7);
      deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&local_40);
      deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)&verifier);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x1fd);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&		log			= m_testCtx.getLog();
		deUint32		dataSeed	= deStringHash(getName());
		deUint32		buf			= 0;
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier	(m_renderCtx, m_testCtx.getLog(), m_verify);
		bool			isOk		= true;

		// Setup reference data.
		refBuf.setSize(m_bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), m_bufferSize, dataSeed);

		buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, m_bufferSize, refBuf.getPtr(), m_usage);

		// Verify before mapping.
		if (!verifier.verify(buf, refBuf.getPtr(), 0, m_bufferSize, m_bufferTarget))
			isOk = false;

		glBindBuffer(m_bufferTarget, buf);
		void* ptr = glMapBufferRange(m_bufferTarget, m_mapOffset, m_mapSize, GL_MAP_READ_BIT|GL_MAP_WRITE_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		// Compare mapped ptr.
		if (!compareByteArrays(log, (const deUint8*)ptr, refBuf.getPtr(m_mapOffset), m_mapSize))
			isOk = false;

		fillWithRandomBytes(refBuf.getPtr(m_mapOffset), m_mapSize, dataSeed&0xabcdef);
		deMemcpy(ptr, refBuf.getPtr(m_mapOffset), m_mapSize);

		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		// Compare final buffer.
		if (!verifier.verify(buf, refBuf.getPtr(), 0, m_bufferSize, m_bufferTarget))
			isOk = false;

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}